

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_exception.cpp
# Opt level: O3

string * __thiscall
BmsFileOpenException::Message_abi_cxx11_(string *__return_storage_ptr__,BmsFileOpenException *this)

{
  ostream *poVar1;
  stringstream os;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"BMS File open failed. ",0x16);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,(this->filename_)._M_dataplus._M_p,
                      (this->filename_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string
BmsFileOpenException::Message( void ) const
{
  std::stringstream os;
  os << "BMS File open failed. " << filename_ << "(" << error_number_ << ")";
  return os.str();
}